

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

void __thiscall
icu_63::UnifiedCache::_put
          (UnifiedCache *this,UHashElement *element,SharedObject *value,UErrorCode status)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  SharedObject *value_00;
  void *pvVar4;
  
  value_00 = (SharedObject *)(element->value).pointer;
  pvVar4 = (element->key).pointer;
  *(UErrorCode *)((long)pvVar4 + 8) = status;
  iVar3 = value->softRefCount;
  if (iVar3 == 0) {
    *(undefined1 *)((long)pvVar4 + 0xc) = 1;
    value->cachePtr = &this->super_UnifiedCacheBase;
    uVar1 = this->fNumValuesTotal;
    uVar2 = this->fNumValuesInUse;
    this->fNumValuesTotal = uVar1 + 1;
    this->fNumValuesInUse = uVar2 + 1;
  }
  value->softRefCount = iVar3 + 1;
  (element->value).pointer = value;
  removeSoftRef(this,value_00);
  umtx_condBroadcast_63(&gInProgressValueAddedCond);
  return;
}

Assistant:

void UnifiedCache::_put(
        const UHashElement *element,
        const SharedObject *value,
        const UErrorCode status) const {
    U_ASSERT(_inProgress(element));
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    const SharedObject *oldValue = (const SharedObject *) element->value.pointer;
    theKey->fCreationStatus = status;
    if (value->softRefCount == 0) {
        _registerMaster(theKey, value);
    }
    value->softRefCount++;
    UHashElement *ptr = const_cast<UHashElement *>(element);
    ptr->value.pointer = (void *) value;
    U_ASSERT(oldValue == fNoValue);
    removeSoftRef(oldValue);

    // Tell waiting threads that we replace in-progress status with
    // an error.
    umtx_condBroadcast(&gInProgressValueAddedCond);
}